

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O3

int XMLSearch_init_from_XPath(SXML_CHAR *xpath,XMLSearch *search)

{
  char *pcVar1;
  char cVar2;
  SXML_CHAR SVar3;
  SXML_CHAR SVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  SXML_CHAR *attr_value;
  char cVar8;
  SXML_CHAR *pSVar9;
  SXML_CHAR *pSVar10;
  char *tag;
  XMLSearch *pXVar11;
  XMLSearch *pXVar12;
  SXML_CHAR *pSVar13;
  SXML_CHAR SVar14;
  char *pcVar15;
  int local_64;
  int r0;
  int l1;
  int is;
  int l0;
  XMLSearch *local_50;
  char *local_48;
  XMLSearch *local_40;
  XMLSearch *local_38;
  
  if (search == (XMLSearch *)0x0) {
LAB_00106fbb:
    iVar5 = 0;
  }
  else {
    search->tag = (SXML_CHAR *)0x0;
    search->attributes = (XMLAttribute *)0x0;
    search->n_attributes = 0;
    search->text = (SXML_CHAR *)0x0;
    search->next = (_XMLSearch *)0x0;
    search->prev = (_XMLSearch *)0x0;
    search->stop_at = (XMLNode *)0xffffffffffffffff;
    search->init_value = 0x19770522;
    iVar5 = 1;
    if ((xpath != (SXML_CHAR *)0x0) && (*xpath != '\0')) {
      pcVar7 = strdup(xpath);
      cVar8 = *pcVar7;
      if (cVar8 != '\0') {
        pXVar12 = (XMLSearch *)0x0;
        pXVar11 = search;
        tag = pcVar7;
        do {
          if ((search != pXVar11) &&
             (search = (XMLSearch *)calloc(1,0x40), search == (XMLSearch *)0x0)) {
            free(pcVar7);
LAB_00106fb1:
            XMLSearch_free(pXVar11,1);
            goto LAB_00106fbb;
          }
          while (cVar8 == '/') {
            pcVar15 = tag + 1;
            tag = tag + 1;
            cVar8 = *pcVar15;
          }
          pSVar9 = tag;
          if (cVar8 == '\0') {
            free(pcVar7);
            goto LAB_00106fbb;
          }
          do {
            while (cVar8 = pSVar9[1], cVar8 != '\\') {
              pcVar15 = pSVar9 + 1;
              if ((cVar8 == '\0') || (pSVar9 = pcVar15, cVar8 == '/')) goto LAB_00106d0b;
            }
            pcVar15 = pSVar9 + 2;
            pcVar1 = pSVar9 + 2;
            pSVar9 = pcVar15;
          } while (*pcVar1 != '\0');
          cVar8 = '\0';
LAB_00106d0b:
          *pcVar15 = '\0';
          pSVar9 = tag;
          if (search != (XMLSearch *)0x0) {
            search->tag = (SXML_CHAR *)0x0;
            search->attributes = (XMLAttribute *)0x0;
            search->n_attributes = 0;
            search->text = (SXML_CHAR *)0x0;
            search->next = (_XMLSearch *)0x0;
            search->prev = (_XMLSearch *)0x0;
            search->stop_at = (XMLNode *)0xffffffffffffffff;
            search->init_value = 0x19770522;
          }
          for (; (cVar2 = *pSVar9, cVar2 != '\0' && (cVar2 != '[')); pSVar9 = pSVar9 + 1) {
          }
          *pSVar9 = '\0';
          local_50 = search;
          local_48 = pcVar7;
          local_40 = pXVar11;
          local_38 = pXVar12;
          iVar5 = XMLSearch_search_set_tag(search,tag);
          *pSVar9 = cVar2;
          if (iVar5 == 0) {
LAB_00106fa2:
            free(local_48);
            pXVar11 = local_40;
            goto LAB_00106fb1;
          }
          if (cVar2 != '\0') {
            while ((cVar2 = pSVar9[1], cVar2 != '\0' && (cVar2 != ']'))) {
              pSVar10 = pSVar9 + 1;
              pSVar13 = pSVar9 + 2;
              SVar14 = cVar2;
              while (SVar14 != '\0') {
                if ((SVar14 == ',') || (SVar14 == ']')) {
                  pSVar13[-1] = '\0';
                  cVar2 = *pSVar10;
                  break;
                }
                SVar14 = *pSVar13;
                pSVar13 = pSVar13 + 1;
              }
              if (cVar2 == '@') {
                pSVar10 = pSVar9 + 2;
                iVar5 = split_left_right(pSVar10,'=',&l0,&l1,&is,&r0,&local_64,1,1);
                if (iVar5 == 0) goto LAB_00106fa2;
                SVar3 = pSVar9[(long)l1 + 3];
                SVar4 = pSVar9[(long)local_64 + 3];
                pSVar9[(long)l1 + 3] = '\0';
                pSVar9[(long)local_64 + 3] = '\0';
                attr_value = (SXML_CHAR *)0x0;
                if (-1 < is) {
                  attr_value = pSVar10 + r0;
                }
                uVar6 = XMLSearch_search_add_attribute(local_50,pSVar10 + l0,attr_value,1);
                uVar6 = ~uVar6 >> 0x1f;
                pSVar9[(long)l1 + 3] = SVar3;
                pSVar9[(long)local_64 + 3] = SVar4;
                pSVar10 = pSVar10 + (long)local_64 + -1;
              }
              else {
                uVar6 = 1;
                if (cVar2 == '.') {
                  iVar5 = split_left_right(pSVar10,'=',&l0,&l1,&is,&r0,&local_64,1,1);
                  pXVar11 = local_50;
                  if (iVar5 == 0) goto LAB_00106fa2;
                  SVar3 = pSVar9[(long)local_64 + 2];
                  pSVar9[(long)local_64 + 2] = '\0';
                  if (local_50 == (XMLSearch *)0x0) {
                    uVar6 = 0;
                  }
                  else {
                    pcVar7 = strdup(pSVar10 + r0);
                    pXVar11->text = pcVar7;
                    uVar6 = (uint)(pcVar7 != (char *)0x0);
                  }
                  pSVar9[(long)local_64 + 2] = SVar3;
                  pSVar10 = pSVar10 + (long)local_64 + 1;
                }
              }
              pSVar9 = pSVar10;
              pSVar13[-1] = SVar14;
              if (uVar6 == 0) goto LAB_00106fa2;
            }
          }
          *pcVar15 = cVar8;
          if (local_38 != (XMLSearch *)0x0) {
            local_38->next = local_50;
          }
          if (local_50 != local_40) {
            local_50->prev = local_38;
          }
          cVar8 = *pcVar15;
          search = (XMLSearch *)0x0;
          pcVar7 = local_48;
          pXVar12 = local_50;
          pXVar11 = local_40;
          tag = pcVar15;
        } while (cVar8 != '\0');
      }
      iVar5 = 1;
      free(pcVar7);
    }
  }
  return iVar5;
}

Assistant:

int XMLSearch_init_from_XPath(const SXML_CHAR* xpath, XMLSearch* search)
{
	XMLSearch *search1, *search2;
	SXML_CHAR *p, *tag, *tag0;
	SXML_CHAR c;

	if (!XMLSearch_init(search))
		return FALSE;

	/* NULL or empty xpath is an empty (initialized only) search */
	if (xpath == NULL || *xpath == NULC)
		return TRUE;

	search1 = NULL;		/* Search struct to add the xpath portion to */
	search2 = search;	/* Search struct to be filled from xpath portion */

	tag = tag0 = sx_strdup(xpath); /* Create a copy of 'xpath' to be able to patch it (or segfault if 'xpath' is const, cnacu6o Sergey@sourceforge!) */
	while (*tag != NULC) {
		if (search2 != search) { /* Allocate a new search when the original one (i.e. 'search') has already been filled */
			search2 = (XMLSearch*)__calloc(1, sizeof(XMLSearch));
			if (search2 == NULL) {
				__free(tag0);
				(void)XMLSearch_free(search, TRUE);
				return FALSE;
			}
		}
		/* Skip all first '/' */
		for (; *tag != NULC && *tag == C2SX('/'); tag++) ;
		if (*tag == NULC) {
			__free(tag0);
			return FALSE;
		}

		/* Look for the end of tag name: after '/' (to get another tag) or end of string */
		for (p = &tag[1]; *p != NULC && *p != C2SX('/'); p++) {
			if (*p == C2SX('\\') && *++p == NULC)
				break; /* Escape character, '\' could be the last character... */
		}
		c = *p; /* Backup character before nulling it */
		*p = NULC;
		if (!_init_search_from_1XPath(tag, search2)) {
			__free(tag0);
			(void)XMLSearch_free(search, TRUE);
			return FALSE;
		}
		*p = c;

		/* 'search2' is the newly parsed tag, 'search1' is the previous tag (or NULL if 'search2' is the first tag to parse (i.e. 'search2' == 'search') */

		if (search1 != NULL) search1->next = search2;
		if (search2 != search) search2->prev = search1;
		search1 = search2;
		search2 = NULL; /* Will force allocation during next loop */
		tag = p;
	}

	__free(tag0);
	return TRUE;
}